

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O3

void __thiscall
bssl::ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarilyAndMaximum_Test::
~ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarilyAndMaximum_Test
          (ParseNameConstraints_failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarilyAndMaximum_Test
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ParseNameConstraints,
       failsOnGeneralSubtreeWithMinimumZeroEncodedUnnecessarilyAndMaximum) {
  std::string constraints_der;
  ASSERT_TRUE(LoadTestNameConstraint("dnsname-with_min_0_and_max.pem",
                                     &constraints_der));
  CertErrors errors;
  EXPECT_FALSE(NameConstraints::Create(StringAsBytes(constraints_der),
                                       is_critical(), &errors));
}